

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall cmComputeLinkInformation::ComputeItemParserInfo(cmComputeLinkInformation *this)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  cmMakefile *this_00;
  undefined8 uVar3;
  undefined8 uVar4;
  string *psVar5;
  cmValue cVar6;
  _Base_ptr p_Var7;
  string *i_1;
  string *i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  string_view arg;
  string_view arg_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkSuffixVec;
  string reg;
  string reg_static;
  string libext;
  string reg_any;
  undefined1 local_f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = this->Makefile;
  psVar2 = (string *)(local_f0 + 0x10);
  local_f0._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"CMAKE_STATIC_LIBRARY_PREFIX","");
  psVar5 = cmMakefile::GetSafeDefinition(this_00,(string *)local_f0);
  if (psVar5->_M_string_length != 0) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->LinkPrefixes,psVar5);
  }
  if ((string *)local_f0._0_8_ != psVar2) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  local_f0._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"CMAKE_SHARED_LIBRARY_PREFIX","");
  psVar5 = cmMakefile::GetSafeDefinition(this_00,(string *)local_f0);
  if (psVar5->_M_string_length != 0) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->LinkPrefixes,psVar5);
  }
  if ((string *)local_f0._0_8_ != psVar2) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  local_f0._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"CMAKE_IMPORT_LIBRARY_SUFFIX","");
  psVar5 = cmMakefile::GetSafeDefinition(this_00,(string *)local_f0);
  AddLinkExtension(this,psVar5,LinkShared);
  if ((string *)local_f0._0_8_ != psVar2) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  local_f0._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"CMAKE_STATIC_LIBRARY_SUFFIX","");
  psVar5 = cmMakefile::GetSafeDefinition(this_00,(string *)local_f0);
  AddLinkExtension(this,psVar5,LinkStatic);
  if ((string *)local_f0._0_8_ != psVar2) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  local_f0._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"CMAKE_SHARED_LIBRARY_SUFFIX","");
  psVar5 = cmMakefile::GetSafeDefinition(this_00,(string *)local_f0);
  AddLinkExtension(this,psVar5,LinkShared);
  if ((string *)local_f0._0_8_ != psVar2) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  local_f0._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"CMAKE_LINK_LIBRARY_SUFFIX","")
  ;
  psVar5 = cmMakefile::GetSafeDefinition(this_00,(string *)local_f0);
  if (psVar5->_M_string_length != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->LinkExtensions,psVar5);
  }
  if ((string *)local_f0._0_8_ != psVar2) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  local_f0._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"CMAKE_EXTRA_LINK_EXTENSIONS","");
  cVar6 = cmMakefile::GetDefinition(this_00,(string *)local_f0);
  if ((string *)local_f0._0_8_ != psVar2) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  if (cVar6.Value != (string *)0x0) {
    arg._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar6.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_f0,arg,false);
    uVar3 = local_f0._8_8_;
    if (local_f0._0_8_ != local_f0._8_8_) {
      __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0._0_8_;
      do {
        if (__args->_M_string_length != 0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->LinkExtensions,__args);
        }
        __args = __args + 1;
      } while (__args != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar3)
      ;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f0);
  }
  local_f0._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES","");
  cVar6 = cmMakefile::GetDefinition(this_00,(string *)local_f0);
  if ((string *)local_f0._0_8_ != psVar2) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  if (cVar6.Value != (string *)0x0) {
    arg_00._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
    arg_00._M_len = (cVar6.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_f0,arg_00,false);
    for (psVar5 = (string *)local_f0._0_8_; psVar5 != (string *)local_f0._8_8_; psVar5 = psVar5 + 1)
    {
      AddLinkExtension(this,psVar5,LinkShared);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f0);
  }
  CreateExtensionRegex(&local_90,this,&this->LinkExtensions,LinkUnknown);
  local_d0._M_allocated_capacity = (size_type)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"(.*)","");
  std::__cxx11::string::_M_append(local_d0._M_local_buf,(ulong)local_90._M_dataplus._M_p);
  cmOrderDirectories::SetLinkExtensionInfo
            ((this->OrderLinkerSearchPath)._M_t.
             super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
             super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,&this->LinkExtensions,
             (string *)&local_d0);
  std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)local_d0._8_8_,0x6c8bfb);
  p_Var7 = (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      std::__cxx11::string::_M_append(local_d0._M_local_buf,*(ulong *)(p_Var7 + 1));
      std::__cxx11::string::append(local_d0._M_local_buf);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  std::__cxx11::string::append(local_d0._M_local_buf);
  std::__cxx11::string::append(local_d0._M_local_buf);
  local_f0._0_8_ = local_d0._8_8_;
  local_f0._8_8_ = local_d0._M_allocated_capacity;
  local_f0._16_8_ = local_90._M_string_length;
  local_f0._24_8_ = local_90._M_dataplus._M_p;
  views._M_len = 2;
  views._M_array = (iterator)local_f0;
  cmCatViews_abi_cxx11_(&local_50,views);
  cmsys::RegularExpression::compile(&this->ExtractAnyLibraryName,local_50._M_dataplus._M_p);
  uVar4 = local_d0._8_8_;
  uVar3 = local_d0._M_allocated_capacity;
  if ((this->StaticLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->StaticLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    CreateExtensionRegex(&local_70,this,&this->StaticLinkExtensions,LinkStatic);
    local_f0._0_8_ = uVar4;
    local_f0._8_8_ = uVar3;
    local_f0._16_8_ = local_70._M_string_length;
    local_f0._24_8_ = local_70._M_dataplus._M_p;
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_f0;
    cmCatViews_abi_cxx11_(&local_b0,views_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    cmsys::RegularExpression::compile(&this->ExtractStaticLibraryName,local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->SharedLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->SharedLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_f0._0_8_ = psVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_f0,local_d0._M_allocated_capacity,
               (undefined1 *)(local_d0._8_8_ + local_d0._M_allocated_capacity));
    CreateExtensionRegex(&local_b0,this,&this->SharedLinkExtensions,LinkShared);
    std::__cxx11::string::operator=((string *)&this->SharedRegexString,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append(local_f0,(ulong)(this->SharedRegexString)._M_dataplus._M_p);
    cmsys::RegularExpression::compile(&this->ExtractSharedLibraryName,(char *)local_f0._0_8_);
    if ((string *)local_f0._0_8_ != psVar2) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_allocated_capacity != &local_c0) {
    operator_delete((void *)local_d0._M_allocated_capacity,local_c0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeItemParserInfo()
{
  // Get possible library name prefixes.
  cmMakefile* mf = this->Makefile;
  this->AddLinkPrefix(mf->GetSafeDefinition("CMAKE_STATIC_LIBRARY_PREFIX"));
  this->AddLinkPrefix(mf->GetSafeDefinition("CMAKE_SHARED_LIBRARY_PREFIX"));

  // Import library names should be matched and treated as shared
  // libraries for the purposes of linking.
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_STATIC_LIBRARY_SUFFIX"),
                         LinkStatic);
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_SHARED_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_LINK_LIBRARY_SUFFIX"),
                         LinkUnknown);
  if (cmValue linkSuffixes =
        mf->GetDefinition("CMAKE_EXTRA_LINK_EXTENSIONS")) {
    std::vector<std::string> linkSuffixVec = cmExpandedList(*linkSuffixes);
    for (std::string const& i : linkSuffixVec) {
      this->AddLinkExtension(i, LinkUnknown);
    }
  }
  if (cmValue sharedSuffixes =
        mf->GetDefinition("CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES")) {
    std::vector<std::string> sharedSuffixVec = cmExpandedList(*sharedSuffixes);
    for (std::string const& i : sharedSuffixVec) {
      this->AddLinkExtension(i, LinkShared);
    }
  }

  // Compute a regex to match link extensions.
  std::string libext =
    this->CreateExtensionRegex(this->LinkExtensions, LinkUnknown);

  // Create regex to remove any library extension.
  std::string reg("(.*)");
  reg += libext;
  this->OrderLinkerSearchPath->SetLinkExtensionInfo(this->LinkExtensions, reg);

  // Create a regex to match a library name.  Match index 1 will be
  // the prefix if it exists and empty otherwise.  Match index 2 will
  // be the library name.  Match index 3 will be the library
  // extension.
  reg = "^(";
  for (std::string const& p : this->LinkPrefixes) {
    reg += p;
    reg += "|";
  }
  reg += ")";
  reg += "([^/:]*)";

  // Create a regex to match any library name.
  std::string reg_any = cmStrCat(reg, libext);
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
  fprintf(stderr, "any regex [%s]\n", reg_any.c_str());
#endif
  this->ExtractAnyLibraryName.compile(reg_any);

  // Create a regex to match static library names.
  if (!this->StaticLinkExtensions.empty()) {
    std::string reg_static = cmStrCat(
      reg, this->CreateExtensionRegex(this->StaticLinkExtensions, LinkStatic));
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "static regex [%s]\n", reg_static.c_str());
#endif
    this->ExtractStaticLibraryName.compile(reg_static);
  }

  // Create a regex to match shared library names.
  if (!this->SharedLinkExtensions.empty()) {
    std::string reg_shared = reg;
    this->SharedRegexString =
      this->CreateExtensionRegex(this->SharedLinkExtensions, LinkShared);
    reg_shared += this->SharedRegexString;
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "shared regex [%s]\n", reg_shared.c_str());
#endif
    this->ExtractSharedLibraryName.compile(reg_shared);
  }
}